

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
csguide_webserver::Logger::Log<char_const*,char_const*,char_const*>
          (Logger *this,LogLevel level,string *fmt_str,char *args,char *args_1,char *args_2)

{
  char *pcVar1;
  ostream *poVar2;
  undefined8 in_RCX;
  LogLevel in_ESI;
  Logger *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  string formatted_msg;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined1 local_e9 [33];
  string local_c8 [32];
  string local_a8 [55];
  allocator local_71;
  string local_70 [32];
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  LogLevel local_c;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_c = in_ESI;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,pcVar1,&local_71);
  FormatMessage((Logger *)&stack0xffffffffffffffb0,(string *)in_RDI,local_70,local_20,local_28,
                local_30);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  LogLevelToString(in_RDI,local_c);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_e9 + 1),": ",(allocator *)__lhs);
  std::operator+((char *)__lhs,in_stack_fffffffffffffee0);
  std::operator+(__lhs,in_stack_fffffffffffffee0);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string((string *)(local_e9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_e9);
  if ((in_RDI->use_file_ & 1U) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,local_a8);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)in_RDI,local_a8);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  return;
}

Assistant:

void Logger::Log(LogLevel level, const std::string& fmt_str, Args... args) {
  std::string message = FormatMessage(fmt_str.c_str(), args...);
  std::string formatted_msg = LogLevelToString(level) + std::string(": ") + message;

  if (use_file_) {
    log_file_ << formatted_msg << std::endl;
  } else {
    std::cout << formatted_msg << std::endl;
  }
}